

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void sarimatest(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *inp_00;
  sarima_object obj_00;
  double temp2 [1200];
  double temp [1200];
  FILE *ifp;
  sarima_object obj;
  double *amse;
  double *xpred;
  double *THETA;
  double *PHI;
  double *theta;
  double *phi;
  int Q;
  int D;
  int P;
  int s;
  int q;
  int p;
  double *inp;
  int L;
  int d;
  int N;
  int i;
  
  __ptr = malloc(0);
  __ptr_00 = malloc(8);
  __ptr_01 = malloc(0);
  __ptr_02 = malloc(8);
  xpred_00 = (double *)malloc(0x28);
  amse_00 = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp2 + (long)d + 0x4af);
      d = d + 1;
    }
    inp_00 = (double *)malloc((long)d << 3);
    for (d = 0; d < N_00; d = d + 1) {
      inp_00[d] = temp2[(long)d + 0x4af];
    }
    obj_00 = sarima_init(0,1,1,0xc,0,1,1,N_00);
    sarima_setMethod(obj_00,1);
    sarima_setCSSML(obj_00,0);
    sarima_exec(obj_00,inp_00);
    sarima_summary(obj_00);
    sarima_predict(obj_00,inp_00,5,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 5; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 5; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    sarima_free(obj_00);
    free(inp_00);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(xpred_00);
    free(amse_00);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *phi, *theta;
	double *PHI, *THETA;
	double *xpred, *amse;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 1;
	Q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
	PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	//ifp = fopen("../data/itdaily.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarima_init(p, d, q,s,P,D,Q, N);
	sarima_setMethod(obj, 1); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	sarima_setCSSML(obj,0); // 0 - Only MLE , 1 - CSS + MLE
	//sarima_setOptMethod(obj, 7);// Method 5 ("BFGS") is default . The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarima_exec(obj, inp);
	sarima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
}